

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O1

Matrix<int> __thiscall Matrix<int>::operator=(Matrix<int> *this,Matrix<int> *R)

{
  long lVar1;
  int **ppiVar2;
  long lVar3;
  int *piVar4;
  int *in_RDX;
  int **extraout_RDX;
  long lVar5;
  long lVar6;
  Matrix<int> MVar7;
  
  R->n = *in_RDX;
  R->m = in_RDX[1];
  if (0 < *in_RDX) {
    lVar1 = *(long *)(in_RDX + 2);
    ppiVar2 = R->M;
    lVar5 = 0;
    do {
      if (0 < in_RDX[1]) {
        lVar3 = *(long *)(lVar1 + lVar5 * 8);
        piVar4 = ppiVar2[lVar5];
        lVar6 = 0;
        do {
          piVar4[lVar6] = *(int *)(lVar3 + lVar6 * 4);
          lVar6 = lVar6 + 1;
        } while (lVar6 < in_RDX[1]);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < *in_RDX);
  }
  Matrix(this,R);
  MVar7.M = extraout_RDX;
  MVar7._0_8_ = this;
  return MVar7;
}

Assistant:

Matrix operator=(const Matrix& R) {
    n = R.n;
    m = R.m;
    for (int i = 0; i < R.n; i++) {
      for (int j = 0; j < R.m; j++) {
        M[i][j] = R.M[i][j];
      }
    }
    return *this;
  }